

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

bool __thiscall
cmConditionEvaluator::HandleLevel3
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  static_string_view keyword;
  size_t sVar1;
  char *pcVar2;
  bool bVar3;
  reference pcVar4;
  bool rhs;
  _Self local_40;
  undefined1 local_38 [8];
  CurrentAndNextIter args;
  MessageType *status_local;
  string *errorString_local;
  cmArgumentList *newArgs_local;
  cmConditionEvaluator *this_local;
  
  args.next._M_node = (_List_node_base *)status;
  _local_38 = cmArgumentList::make2ArgsIterator(newArgs);
  while( true ) {
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
         end(&newArgs->
              super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>);
    bVar3 = std::operator!=(&args.current,&local_40);
    pcVar2 = DAT_01805f10;
    sVar1 = (anonymous_namespace)::keyNOT;
    if (!bVar3) break;
    pcVar4 = std::_List_iterator<cmExpandedCommandArgument>::operator*
                       ((_List_iterator<cmExpandedCommandArgument> *)local_38);
    keyword.super_string_view._M_str = pcVar2;
    keyword.super_string_view._M_len = sVar1;
    bVar3 = IsKeyword(this,keyword,pcVar4);
    if (bVar3) {
      pcVar4 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&args.current);
      bVar3 = GetBooleanValueWithAutoDereference
                        (this,pcVar4,errorString,(MessageType *)args.next._M_node,false);
      cmArgumentList::ReduceOneArg<cmConditionEvaluator::cmArgumentList::CurrentAndNextIter>
                (newArgs,(bool)((bVar3 ^ 0xffU) & 1),_local_38);
    }
    cmArgumentList::CurrentAndNextIter::advance
              ((CurrentAndNextIter *)local_38,
               &newArgs->
                super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>);
  }
  return true;
}

Assistant:

bool cmConditionEvaluator::HandleLevel3(cmArgumentList& newArgs,
                                        std::string& errorString,
                                        MessageType& status)
{
  for (auto args = newArgs.make2ArgsIterator(); args.next != newArgs.end();
       args.advance(newArgs)) {
    if (this->IsKeyword(keyNOT, *args.current)) {
      const auto rhs = this->GetBooleanValueWithAutoDereference(
        *args.next, errorString, status);
      newArgs.ReduceOneArg(!rhs, args);
    }
  }
  return true;
}